

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8UserNoticeQualifierTest19<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section8UserNoticeQualifierTest19
          (Section8UserNoticeQualifierTest19<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8UserNoticeQualifierTest19) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "UserNoticeQualifierTest19EE"};
  const char* const crls[] = {"TrustAnchorRootCRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.19";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}